

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool __thiscall cmGeneratorTarget::HasImplibGNUtoMS(cmGeneratorTarget *this)

{
  bool bVar1;
  string local_48;
  
  if (this->DLLPlatform == true) {
    bVar1 = true;
    if (this->Target->TargetTypeValue != SHARED_LIBRARY) {
      bVar1 = IsExecutableWithExports(this);
    }
  }
  else {
    bVar1 = false;
  }
  if (bVar1 == false) {
    bVar1 = false;
  }
  else {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"GNUtoMS","");
    bVar1 = cmTarget::GetPropertyAsBool(this->Target,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar1;
}

Assistant:

bool cmGeneratorTarget::HasImplibGNUtoMS() const
{
  return this->HasImportLibrary()
      && this->GetPropertyAsBool("GNUtoMS");
}